

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_poly_vector.h
# Opt level: O0

void __thiscall
Impl2T<poly::virtual_cloning_policy>::Impl2T
          (Impl2T<poly::virtual_cloning_policy> *this,Impl2T<poly::virtual_cloning_policy> *o)

{
  Impl2T<poly::virtual_cloning_policy> *o_local;
  Impl2T<poly::virtual_cloning_policy> *this_local;
  
  Interface::Interface(&this->super_Interface,false);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR_function_005cb620;
  poly::vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::vector
            (&this->v,&o->v);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::unique_ptr(&this->p,&o->p);
  Cookie::Cookie(&this->cookie);
  Cookie::set(&this->cookie);
  return;
}

Assistant:

Impl2T(Impl2T&& o) noexcept
        : v { std::move(o.v) }
        , p { std::move(o.p) }
    {
        cookie.set();
    }